

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenavitHartenberg.cpp
# Opt level: O1

bool iDynTree::closestPoints
               (Axis *line_A,Axis *line_B,Position *closest_point_line_A,
               Position *closest_point_line_B,double tol)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  PointerType ptr;
  double *pdVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  
  pdVar13 = (double *)iDynTree::Axis::getOrigin();
  dVar7 = *pdVar13;
  dVar8 = pdVar13[1];
  dVar1 = pdVar13[2];
  pdVar13 = (double *)iDynTree::Axis::getOrigin();
  dVar9 = *pdVar13;
  dVar10 = pdVar13[1];
  dVar2 = pdVar13[2];
  pdVar13 = (double *)iDynTree::Axis::getDirection();
  dVar11 = *pdVar13;
  dVar12 = pdVar13[1];
  dVar3 = pdVar13[2];
  pdVar13 = (double *)iDynTree::Axis::getDirection();
  dVar5 = *pdVar13;
  dVar6 = pdVar13[1];
  dVar4 = pdVar13[2];
  dVar14 = dVar3 * dVar3 + dVar12 * dVar12 + dVar11 * dVar11;
  dVar15 = dVar3 * dVar4 + dVar12 * dVar6 + dVar11 * dVar5;
  dVar17 = dVar4 * dVar4 + dVar6 * dVar6 + dVar5 * dVar5;
  dVar16 = dVar14 * dVar17 - dVar15 * dVar15;
  if (tol <= ABS(dVar16)) {
    dVar18 = dVar7 - dVar9;
    dVar19 = dVar8 - dVar10;
    dVar20 = dVar1 - dVar2;
    dVar21 = dVar20 * dVar4 + dVar19 * dVar6 + dVar18 * dVar5;
    dVar18 = dVar20 * dVar3 + dVar19 * dVar12 + dVar18 * dVar11;
    dVar17 = (dVar15 * dVar21 - dVar17 * dVar18) / dVar16;
    dVar14 = (dVar14 * dVar21 + dVar18 * -dVar15) / dVar16;
    *(double *)closest_point_line_A = dVar17 * dVar11 + dVar7;
    *(double *)(closest_point_line_A + 8) = dVar17 * dVar12 + dVar8;
    *(double *)(closest_point_line_A + 0x10) = dVar3 * dVar17 + dVar1;
    *(double *)closest_point_line_B = dVar14 * dVar5 + dVar9;
    *(double *)(closest_point_line_B + 8) = dVar14 * dVar6 + dVar10;
    *(double *)(closest_point_line_B + 0x10) = dVar4 * dVar14 + dVar2;
  }
  return tol <= ABS(dVar16);
}

Assistant:

bool closestPoints(const iDynTree::Axis line_A,
                   const iDynTree::Axis line_B,
                         iDynTree::Position & closest_point_line_A,
                         iDynTree::Position & closest_point_line_B,
                         double tol = 1e-6
                  )
{
    /*
      Using the notation in : http://geomalgorithms.com/a07-_distance.html
      direction_line_A is u
      origin_line_A is P_0
      direction_line_B is v
      origin_line_b is Q_0
      closest_point_line_A is P_C
      closest_point_line_B is Q_C
    */


    Eigen::Vector3d origin_line_A = toEigen(line_A.getOrigin());
    Eigen::Vector3d origin_line_B = toEigen(line_B.getOrigin());
    Eigen::Vector3d direction_line_A = toEigen(line_A.getDirection());
    Eigen::Vector3d direction_line_B = toEigen(line_B.getDirection());

    Eigen::Vector3d w0 = origin_line_A-origin_line_B;
    double a = direction_line_A.dot(direction_line_A);
    double b = direction_line_A.dot(direction_line_B);
    double c = direction_line_B.dot(direction_line_B);
    double d = direction_line_A.dot(w0);
    double e = direction_line_B.dot(w0);

    double denominator = a*c-b*b;

    // test with fabs because sometimes the numerical zero is computed as -epsilon
    if( fabs(denominator) < tol )
    {
        return false;
    }

    //Denominator should be nonnegative
    assert(denominator >= 0.0);

    double s_C = (b*e-c*d)/denominator;
    double t_C = (a*e-b*d)/denominator;

    toEigen(closest_point_line_A) = origin_line_A + s_C*direction_line_A;
    toEigen(closest_point_line_B) = origin_line_B + t_C*direction_line_B;

    return true;
}